

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::InterpFixupPass::Process(InterpFixupPass *this)

{
  _Rb_tree_header *p_Var1;
  IRContext *pIVar2;
  Module *pMVar3;
  pointer puVar4;
  InterpFoldingRules *this_00;
  long *plVar5;
  Status SVar6;
  pointer puVar7;
  bool changed;
  byte local_69;
  IRContext *local_68;
  long *local_60;
  InterpFoldingRules *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_69 = 0;
  pIVar2 = (this->super_Pass).context_;
  this_00 = (InterpFoldingRules *)operator_new(0x90);
  (this_00->super_FoldingRules).rules_._M_h._M_buckets =
       &(this_00->super_FoldingRules).rules_._M_h._M_single_bucket;
  (this_00->super_FoldingRules).rules_._M_h._M_bucket_count = 1;
  (this_00->super_FoldingRules).rules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->super_FoldingRules).rules_._M_h._M_element_count = 0;
  (this_00->super_FoldingRules).rules_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->super_FoldingRules).rules_._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->super_FoldingRules).rules_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this_00->super_FoldingRules).ext_rules_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_FoldingRules).context_ = pIVar2;
  (this_00->super_FoldingRules).empty_vector_.
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_FoldingRules).empty_vector_.
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_FoldingRules).empty_vector_.
  super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_FoldingRules)._vptr_FoldingRules = (_func_int **)&PTR__FoldingRules_003df108;
  plVar5 = (long *)operator_new(0x90);
  plVar5[1] = (long)(plVar5 + 7);
  plVar5[2] = 1;
  plVar5[3] = 0;
  plVar5[4] = 0;
  *(undefined4 *)(plVar5 + 5) = 0x3f800000;
  plVar5[6] = 0;
  plVar5[7] = 0;
  *(undefined4 *)(plVar5 + 9) = 0;
  plVar5[10] = 0;
  plVar5[0xb] = (long)(plVar5 + 9);
  plVar5[0xc] = (long)(plVar5 + 9);
  plVar5[0xd] = 0;
  plVar5[0xe] = (long)pIVar2;
  plVar5[0xf] = 0;
  plVar5[0x10] = 0;
  plVar5[0x11] = 0;
  *plVar5 = (long)&PTR__ConstantFoldingRules_003df148;
  local_68 = pIVar2;
  local_60 = plVar5;
  local_58 = this_00;
  anon_unknown_0::InterpFoldingRules::AddFoldingRules(this_00);
  (**(code **)(*plVar5 + 0x10))(plVar5);
  pMVar3 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar7 = *(pointer *)
            &(pMVar3->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar4 = (pMVar3->functions_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 == puVar4) {
    SVar6 = SuccessWithoutChange;
  }
  else {
    do {
      local_50._M_unused._M_object = &local_69;
      local_38 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp:111:22)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp:111:22)>
                 ::_M_manager;
      local_50._8_8_ = &local_68;
      Function::ForEachInst
                ((Function *)
                 (puVar7->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,false,false);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar4);
    SVar6 = local_69 & 1 ^ SuccessWithoutChange;
    this_00 = local_58;
    if (local_58 == (InterpFoldingRules *)0x0) goto LAB_00232d88;
  }
  (*(this_00->super_FoldingRules)._vptr_FoldingRules[1])(this_00);
LAB_00232d88:
  local_58 = (InterpFoldingRules *)0x0;
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  return SVar6;
}

Assistant:

Pass::Status InterpFixupPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<InterpFoldingRules>(new InterpFoldingRules(context())),
      MakeUnique<InterpConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}